

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

void Emb_ManComputeSolutions(Emb_Man_t *p,int nDims,int nSols)

{
  float *pfVar1;
  Emb_Dat_t *pEVar2;
  int local_34;
  int local_30;
  int k;
  int j;
  int i;
  float *pY;
  Emb_Dat_t *pX;
  int nSols_local;
  int nDims_local;
  Emb_Man_t *p_local;
  
  if (p->pSols == (float *)0x0) {
    pfVar1 = (float *)calloc((long)(p->nObjs * nSols),4);
    p->pSols = pfVar1;
    for (k = 0; k < nDims; k = k + 1) {
      pEVar2 = Emb_ManVec(p,k);
      for (local_30 = 0; local_30 < nSols; local_30 = local_30 + 1) {
        pfVar1 = Emb_ManSol(p,local_30);
        for (local_34 = 0; local_34 < p->nObjs; local_34 = local_34 + 1) {
          pfVar1[local_34] = pEVar2[local_34] * p->pEigen[local_30][k] + pfVar1[local_34];
        }
      }
    }
    return;
  }
  __assert_fail("p->pSols == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                ,0x57a,"void Emb_ManComputeSolutions(Emb_Man_t *, int, int)");
}

Assistant:

void Emb_ManComputeSolutions( Emb_Man_t * p, int nDims, int nSols )
{
    Emb_Dat_t * pX;
    float * pY;
    int i, j, k;
    assert( p->pSols == NULL );
    p->pSols = ABC_CALLOC( float, p->nObjs * nSols );
    for ( i = 0; i < nDims; i++ )
    {
        pX = Emb_ManVec( p, i );
        for ( j = 0; j < nSols; j++ )
        {
            pY = Emb_ManSol( p, j );
            for ( k = 0; k < p->nObjs; k++ )
                pY[k] += pX[k] * p->pEigen[j][i];
        }
    }
}